

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void handleSystemIncludesDep
               (cmLocalGenerator *lg,cmGeneratorTarget *depTgt,string *config,
               cmGeneratorTarget *headTarget,cmGeneratorExpressionDAGChecker *dagChecker,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *result,bool excludeImported)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  cmGeneratorExpressionDAGChecker *pcVar2;
  cmGeneratorTarget *pcVar3;
  string *psVar4;
  cmGeneratorTarget *pcVar5;
  bool bVar6;
  char *pcVar7;
  cmCompiledGeneratorExpression *pcVar8;
  allocator local_1c9;
  string local_1c8;
  undefined1 local_1a8 [8];
  string local_1a0;
  cmListFileBacktrace local_180;
  undefined1 local_160 [8];
  cmGeneratorExpression ge_1;
  string local_138;
  char *local_118;
  char *dirs_1;
  string local_108;
  undefined1 local_e8 [8];
  string local_e0;
  cmListFileBacktrace local_c0;
  undefined1 local_a0 [8];
  cmGeneratorExpression ge;
  allocator local_69;
  string local_68;
  char *local_48;
  char *dirs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_38;
  bool excludeImported_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result_local;
  cmGeneratorExpressionDAGChecker *dagChecker_local;
  cmGeneratorTarget *headTarget_local;
  string *config_local;
  cmGeneratorTarget *depTgt_local;
  cmLocalGenerator *lg_local;
  
  dirs._7_1_ = excludeImported;
  pvStack_38 = result;
  result_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)dagChecker;
  dagChecker_local = (cmGeneratorExpressionDAGChecker *)headTarget;
  headTarget_local = (cmGeneratorTarget *)config;
  config_local = (string *)depTgt;
  depTgt_local = (cmGeneratorTarget *)lg;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES",&local_69)
  ;
  pcVar7 = cmGeneratorTarget::GetProperty(depTgt,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  local_48 = pcVar7;
  if (pcVar7 != (char *)0x0) {
    cmListFileBacktrace::cmListFileBacktrace(&local_c0);
    cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_a0,&local_c0);
    cmListFileBacktrace::~cmListFileBacktrace(&local_c0);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_e8,local_a0);
    pcVar8 = cm::auto_ptr<cmCompiledGeneratorExpression>::operator->
                       ((auto_ptr<cmCompiledGeneratorExpression> *)local_e8);
    pcVar5 = depTgt_local;
    psVar4 = config_local;
    pcVar3 = headTarget_local;
    pcVar2 = dagChecker_local;
    pvVar1 = result_local;
    std::__cxx11::string::string((string *)&local_108);
    pcVar7 = cmCompiledGeneratorExpression::Evaluate
                       (pcVar8,(cmLocalGenerator *)pcVar5,(string *)pcVar3,false,
                        (cmGeneratorTarget *)pcVar2,(cmGeneratorTarget *)psVar4,
                        (cmGeneratorExpressionDAGChecker *)pvVar1,&local_108);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_e8 + 8),pcVar7,(allocator *)((long)&dirs_1 + 7));
    cmSystemTools::ExpandListArgument((string *)(local_e8 + 8),pvStack_38,false);
    std::__cxx11::string::~string((string *)(local_e8 + 8));
    std::allocator<char>::~allocator((allocator<char> *)((long)&dirs_1 + 7));
    std::__cxx11::string::~string((string *)&local_108);
    cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)local_e8);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_a0);
  }
  bVar6 = cmGeneratorTarget::IsImported((cmGeneratorTarget *)config_local);
  psVar4 = config_local;
  if ((bVar6) && ((dirs._7_1_ & 1) == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_138,"INTERFACE_INCLUDE_DIRECTORIES",
               (allocator *)((long)&ge_1.Backtrace.Cur + 7));
    pcVar7 = cmGeneratorTarget::GetProperty((cmGeneratorTarget *)psVar4,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator((allocator<char> *)((long)&ge_1.Backtrace.Cur + 7));
    if (pcVar7 != (char *)0x0) {
      local_118 = pcVar7;
      cmListFileBacktrace::cmListFileBacktrace(&local_180);
      cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_160,&local_180);
      cmListFileBacktrace::~cmListFileBacktrace(&local_180);
      cmGeneratorExpression::Parse((cmGeneratorExpression *)local_1a8,local_160);
      pcVar8 = cm::auto_ptr<cmCompiledGeneratorExpression>::operator->
                         ((auto_ptr<cmCompiledGeneratorExpression> *)local_1a8);
      pcVar5 = depTgt_local;
      psVar4 = config_local;
      pcVar3 = headTarget_local;
      pcVar2 = dagChecker_local;
      pvVar1 = result_local;
      std::__cxx11::string::string((string *)&local_1c8);
      pcVar7 = cmCompiledGeneratorExpression::Evaluate
                         (pcVar8,(cmLocalGenerator *)pcVar5,(string *)pcVar3,false,
                          (cmGeneratorTarget *)pcVar2,(cmGeneratorTarget *)psVar4,
                          (cmGeneratorExpressionDAGChecker *)pvVar1,&local_1c8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_1a8 + 8),pcVar7,&local_1c9);
      cmSystemTools::ExpandListArgument((string *)(local_1a8 + 8),pvStack_38,false);
      std::__cxx11::string::~string((string *)(local_1a8 + 8));
      std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
      std::__cxx11::string::~string((string *)&local_1c8);
      cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                ((auto_ptr<cmCompiledGeneratorExpression> *)local_1a8);
      cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_160);
    }
  }
  return;
}

Assistant:

static void handleSystemIncludesDep(
  cmLocalGenerator* lg, cmGeneratorTarget const* depTgt,
  const std::string& config, cmGeneratorTarget const* headTarget,
  cmGeneratorExpressionDAGChecker* dagChecker,
  std::vector<std::string>& result, bool excludeImported)
{
  if (const char* dirs =
        depTgt->GetProperty("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES")) {
    cmGeneratorExpression ge;
    cmSystemTools::ExpandListArgument(
      ge.Parse(dirs)->Evaluate(lg, config, false, headTarget, depTgt,
                               dagChecker),
      result);
  }
  if (!depTgt->IsImported() || excludeImported) {
    return;
  }

  if (const char* dirs =
        depTgt->GetProperty("INTERFACE_INCLUDE_DIRECTORIES")) {
    cmGeneratorExpression ge;
    cmSystemTools::ExpandListArgument(
      ge.Parse(dirs)->Evaluate(lg, config, false, headTarget, depTgt,
                               dagChecker),
      result);
  }
}